

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void * parse_and(Parser *parser)

{
  Token *op;
  BinaryExpr *left;
  void *right;
  
  left = (BinaryExpr *)parse_equals(parser);
  while (op = parser->token, op->kind == AND) {
    move(parser);
    right = parse_equals(parser);
    left = new_binary_expr(left,op,right);
  }
  return left;
}

Assistant:

void *parse_and(Parser *parser) {
    void *left = parse_equals(parser);
    Token *tok = token(parser);
    while (token(parser)->kind == AND) {
        tok = token(parser);
        move(parser);
        left = new_binary_expr(left, tok, parse_equals(parser));

    }
    return left;
}